

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::DescriptorFullName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,bool is_descriptor)

{
  string *s;
  undefined7 in_register_00000011;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  s = *(string **)(desc + 8);
  if ((int)CONCAT71(in_register_00000011,is_descriptor) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"google.protobuf",&local_51);
    std::__cxx11::string::string((string *)&local_50,"google.protobuf.internal",&local_52);
    StringReplace(__return_storage_ptr__,s,&local_30,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorFullName(const DescriptorType* desc, bool is_descriptor) {
  if (is_descriptor) {
    return StringReplace(desc->full_name(),
                         "google.protobuf",
                         "google.protobuf.internal", false);
  } else {
    return desc->full_name();
  }
}